

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_interpolation.c
# Opt level: O0

gdImagePtr gdImageRotateNearestNeighbour(gdImagePtr src,float degrees,int bgColor)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  float fVar6;
  double dVar7;
  double dVar8;
  long n;
  long m;
  gdFixed f_n;
  gdFixed f_m;
  gdFixed f_j;
  gdFixed f_i;
  uint j;
  int new_width;
  int new_height;
  gdRect bbox;
  gdImagePtr dst;
  uint local_60;
  uint i;
  uint dst_offset_y;
  uint dst_offset_x;
  gdFixed f_sin;
  gdFixed f_cos;
  gdFixed f_W;
  gdFixed f_H;
  gdFixed f_0_5;
  int src_h;
  int src_w;
  float _angle;
  int bgColor_local;
  float degrees_local;
  gdImagePtr src_local;
  
  fVar6 = (-degrees / 180.0) * 3.1415927;
  iVar1 = src->sx;
  iVar2 = src->sy;
  dVar7 = cos((double)-fVar6);
  dVar8 = sin((double)-fVar6);
  local_60 = 0;
  gdRotatedImageSize(src,degrees,(gdRectPtr)&new_width);
  src_local = gdImageCreateTrueColor(bbox.x,bbox.y);
  if (src_local == (gdImagePtr)0x0) {
    src_local = (gdImagePtr)0x0;
  }
  else {
    src_local->saveAlphaFlag = 1;
    for (dst._4_4_ = 0; dst._4_4_ < (uint)bbox.y; dst._4_4_ = dst._4_4_ + 1) {
      i = 0;
      for (f_i._4_4_ = 0; f_i._4_4_ < (uint)bbox.x; f_i._4_4_ = f_i._4_4_ + 1) {
        lVar3 = (long)(int)((dst._4_4_ - bbox.y / 2) * 0x100);
        lVar4 = (long)(int)((f_i._4_4_ - bbox.x / 2) * 0x100);
        lVar5 = (lVar4 * (long)(dVar8 * 256.0) >> 8) + (lVar3 * (long)(dVar7 * 256.0) >> 8) + 0x80 +
                (long)(iVar2 / 2 << 8) >> 8;
        lVar3 = ((lVar4 * (long)(dVar7 * 256.0) >> 8) - (lVar3 * (long)(dVar8 * 256.0) >> 8)) + 0x80
                + (long)(iVar1 / 2 << 8) >> 8;
        if ((((lVar5 < 1) || (iVar2 + -1 <= lVar5)) || (lVar3 < 1)) || (iVar1 + -1 <= lVar3)) {
          if (local_60 < (uint)bbox.y) {
            src_local->tpixels[local_60][i] = bgColor;
            i = i + 1;
          }
        }
        else if (local_60 < (uint)bbox.y) {
          src_local->tpixels[local_60][i] = src->tpixels[lVar5][lVar3];
          i = i + 1;
        }
      }
      local_60 = local_60 + 1;
    }
  }
  return src_local;
}

Assistant:

static gdImagePtr
gdImageRotateNearestNeighbour(gdImagePtr src, const float degrees,
                              const int bgColor)
{
	float _angle = ((float) (-degrees / 180.0f) * (float)M_PI);
	const int src_w  = gdImageSX(src);
	const int src_h = gdImageSY(src);
	const gdFixed f_0_5 = gd_ftofx(0.5f);
	const gdFixed f_H = gd_itofx(src_h/2);
	const gdFixed f_W = gd_itofx(src_w/2);
	const gdFixed f_cos = gd_ftofx(cos(-_angle));
	const gdFixed f_sin = gd_ftofx(sin(-_angle));

	unsigned int dst_offset_x;
	unsigned int dst_offset_y = 0;
	unsigned int i;
	gdImagePtr dst;
	gdRect bbox;
	int new_height, new_width;

    gdRotatedImageSize(src, degrees, &bbox);
    new_width = bbox.width;
    new_height = bbox.height;

	dst = gdImageCreateTrueColor(new_width, new_height);
	if (!dst) {
		return NULL;
	}
	dst->saveAlphaFlag = 1;
	for (i = 0; i < new_height; i++) {
		unsigned int j;
		dst_offset_x = 0;
		for (j = 0; j < new_width; j++) {
			gdFixed f_i = gd_itofx((int)i - (int)new_height / 2);
			gdFixed f_j = gd_itofx((int)j - (int)new_width  / 2);
			gdFixed f_m = gd_mulfx(f_j,f_sin) + gd_mulfx(f_i,f_cos) + f_0_5 + f_H;
			gdFixed f_n = gd_mulfx(f_j,f_cos) - gd_mulfx(f_i,f_sin) + f_0_5 + f_W;
			long m = gd_fxtoi(f_m);
			long n = gd_fxtoi(f_n);

			if ((m > 0) && (m < src_h-1) && (n > 0) && (n < src_w-1)) {
				if (dst_offset_y < new_height) {
					dst->tpixels[dst_offset_y][dst_offset_x++] = src->tpixels[m][n];
				}
			} else {
				if (dst_offset_y < new_height) {
					dst->tpixels[dst_offset_y][dst_offset_x++] = bgColor;
				}
			}
		}
		dst_offset_y++;
	}
	return dst;
}